

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall
llvm::detail::IEEEFloat::makeNaN(IEEEFloat *this,bool SNaN,bool Negative,APInt *fill)

{
  WordType *dst;
  bool bVar1;
  uint uVar2;
  uint64_t *src;
  uint *puVar3;
  uint local_38;
  uint QNaNBit;
  uint part;
  uint bitsToPreserve;
  integerPart *piStack_28;
  uint numParts;
  integerPart *significand;
  APInt *fill_local;
  bool Negative_local;
  IEEEFloat *pIStack_10;
  bool SNaN_local;
  IEEEFloat *this_local;
  
  this->field_0x12 = this->field_0x12 & 0xf8 | 1;
  this->field_0x12 = this->field_0x12 & 0xf7 | Negative << 3;
  significand = (integerPart *)fill;
  fill_local._6_1_ = Negative;
  fill_local._7_1_ = SNaN;
  pIStack_10 = this;
  piStack_28 = significandParts(this);
  bitsToPreserve = partCount(this);
  if ((significand == (integerPart *)0x0) ||
     (uVar2 = APInt::getNumWords((APInt *)significand), uVar2 < bitsToPreserve)) {
    APInt::tcSet(piStack_28,0,bitsToPreserve);
  }
  dst = piStack_28;
  if (significand != (integerPart *)0x0) {
    src = APInt::getRawData((APInt *)significand);
    part = APInt::getNumWords((APInt *)significand);
    puVar3 = std::min<unsigned_int>(&part,&bitsToPreserve);
    APInt::tcAssign(dst,src,*puVar3);
    uVar2 = this->semantics->precision - 1;
    local_38 = uVar2 >> 6;
    piStack_28[local_38] = (1L << ((byte)uVar2 & 0x3f)) - 1U & piStack_28[local_38];
    while (local_38 = local_38 + 1, local_38 != bitsToPreserve) {
      piStack_28[local_38] = 0;
    }
  }
  uVar2 = this->semantics->precision;
  if ((fill_local._7_1_ & 1) == 0) {
    APInt::tcSetBit(piStack_28,uVar2 - 2);
  }
  else {
    APInt::tcClearBit(piStack_28,uVar2 - 2);
    bVar1 = APInt::tcIsZero(piStack_28,bitsToPreserve);
    if (bVar1) {
      APInt::tcSetBit(piStack_28,uVar2 - 3);
    }
  }
  if (this->semantics == (fltSemantics *)semX87DoubleExtended) {
    APInt::tcSetBit(piStack_28,uVar2 - 1);
  }
  return;
}

Assistant:

void IEEEFloat::makeNaN(bool SNaN, bool Negative, const APInt *fill) {
  category = fcNaN;
  sign = Negative;

  integerPart *significand = significandParts();
  unsigned numParts = partCount();

  // Set the significand bits to the fill.
  if (!fill || fill->getNumWords() < numParts)
    APInt::tcSet(significand, 0, numParts);
  if (fill) {
    APInt::tcAssign(significand, fill->getRawData(),
                    std::min(fill->getNumWords(), numParts));

    // Zero out the excess bits of the significand.
    unsigned bitsToPreserve = semantics->precision - 1;
    unsigned part = bitsToPreserve / 64;
    bitsToPreserve %= 64;
    significand[part] &= ((1ULL << bitsToPreserve) - 1);
    for (part++; part != numParts; ++part)
      significand[part] = 0;
  }

  unsigned QNaNBit = semantics->precision - 2;

  if (SNaN) {
    // We always have to clear the QNaN bit to make it an SNaN.
    APInt::tcClearBit(significand, QNaNBit);

    // If there are no bits set in the payload, we have to set
    // *something* to make it a NaN instead of an infinity;
    // conventionally, this is the next bit down from the QNaN bit.
    if (APInt::tcIsZero(significand, numParts))
      APInt::tcSetBit(significand, QNaNBit - 1);
  } else {
    // We always have to set the QNaN bit to make it a QNaN.
    APInt::tcSetBit(significand, QNaNBit);
  }

  // For x87 extended precision, we want to make a NaN, not a
  // pseudo-NaN.  Maybe we should expose the ability to make
  // pseudo-NaNs?
  if (semantics == &semX87DoubleExtended)
    APInt::tcSetBit(significand, QNaNBit + 1);
}